

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhjfilter.cpp
# Opt level: O0

void __thiscall
Uhj2Encoder::encode(Uhj2Encoder *this,FloatBufferLine *LeftOut,FloatBufferLine *RightOut,
                   FloatBufferLine *InSamples,size_t SamplesToDo)

{
  span<float,_18446744073709551615UL> dst;
  pointer pvVar1;
  float *pfVar2;
  float *pfVar3;
  const_pointer pvVar4;
  float *pfVar5;
  float *src;
  const_iterator pvVar6;
  float *__first;
  const_iterator pvVar7;
  size_type __n;
  const_iterator __first_00;
  pointer ptr;
  reference pvVar8;
  array<float,_128UL> *in_RDI;
  ulong in_R8;
  size_t i_3;
  size_t i_2;
  float *tmpiter;
  size_t i_1;
  size_t i;
  float *sideiter;
  float *miditer;
  float *yinput;
  float *xinput;
  float *winput;
  float *right;
  float *left;
  size_type in_stack_fffffffffffffed8;
  value_type_conflict in_stack_fffffffffffffee0;
  value_type_conflict in_stack_fffffffffffffee4;
  float *in_stack_fffffffffffffee8;
  float *in_stack_fffffffffffffef0;
  float *in_stack_fffffffffffffef8;
  unsigned_long in_stack_ffffffffffffff00;
  float *in_stack_ffffffffffffff08;
  ulong local_b0;
  ulong local_a8;
  span<float,_18446744073709551615UL> local_a0;
  float *local_88;
  ulong local_80;
  ulong local_78;
  float *local_68;
  float *local_58;
  float *local_50;
  
  pvVar1 = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x21e659);
  pfVar2 = al::assume_aligned<16ul,float>(pvVar1);
  pvVar1 = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x21e676);
  pfVar3 = al::assume_aligned<16ul,float>(pvVar1);
  pvVar4 = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x21e693);
  pfVar5 = al::assume_aligned<16ul,float_const>(pvVar4);
  pvVar4 = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x21e6b7);
  src = al::assume_aligned<16ul,float_const>(pvVar4);
  pvVar4 = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x21e6db);
  local_50 = al::assume_aligned<16ul,float_const>(pvVar4);
  std::array<float,_128UL>::cbegin((array<float,_128UL> *)0x21e6f5);
  std::array<float,_128UL>::cend((array<float,_128UL> *)0x21e704);
  std::array<float,_1152UL>::begin((array<float,_1152UL> *)0x21e71a);
  local_58 = std::copy<float_const*,float*>
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        (float *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::
  transform<float_const*,float_const*,float*,Uhj2Encoder::encode(std::array<float,1024ul>&,std::array<float,1024ul>&,std::array<float,1024ul>const*,unsigned_long)::__0>
            (pfVar5,pfVar5 + in_R8,src,local_58);
  std::array<float,_128UL>::cbegin((array<float,_128UL> *)0x21e779);
  std::array<float,_128UL>::cend((array<float,_128UL> *)0x21e78f);
  std::array<float,_1152UL>::begin((array<float,_1152UL> *)0x21e7a5);
  local_68 = std::copy<float_const*,float*>
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        (float *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::
  transform<float_const*,float*,Uhj2Encoder::encode(std::array<float,1024ul>&,std::array<float,1024ul>&,std::array<float,1024ul>const*,unsigned_long)::__1>
            (local_50,local_50 + in_R8,local_68);
  for (local_78 = 0; local_78 < in_R8; local_78 = local_78 + 1) {
    *local_58 = pfVar2[local_78] + pfVar3[local_78] + *local_58;
    local_58 = local_58 + 1;
  }
  for (local_80 = 0; local_80 < in_R8; local_80 = local_80 + 1) {
    *local_68 = (pfVar2[local_80] - pfVar3[local_80]) + *local_68;
    local_68 = local_68 + 1;
  }
  pvVar6 = std::array<float,_1152UL>::cbegin((array<float,_1152UL> *)0x21e900);
  pvVar6 = pvVar6 + in_R8;
  __first = (float *)std::array<float,_128UL>::size(in_RDI);
  std::array<float,_128UL>::begin((array<float,_128UL> *)0x21e92d);
  std::copy_n<float_const*,unsigned_long,float*>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  pvVar7 = std::array<float,_1152UL>::cbegin((array<float,_1152UL> *)0x21e950);
  pvVar7 = pvVar7 + in_R8;
  __n = std::array<float,_128UL>::size(in_RDI + 1);
  std::array<float,_128UL>::begin((array<float,_128UL> *)0x21e98b);
  std::copy_n<float_const*,unsigned_long,float*>(in_stack_ffffffffffffff08,__n,pvVar7);
  __first_00 = std::array<float,_255UL>::cbegin((array<float,_255UL> *)0x21e9ae);
  std::array<float,_255UL>::cend((array<float,_255UL> *)0x21e9c4);
  std::array<float,_1280UL>::begin((array<float,_1280UL> *)0x21e9da);
  local_88 = std::copy<float_const*,float*>
                       (__first,pvVar6,
                        (float *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::
  transform<float_const*,float_const*,float*,Uhj2Encoder::encode(std::array<float,1024ul>&,std::array<float,1024ul>&,std::array<float,1024ul>const*,unsigned_long)::__2>
            (pfVar5,pfVar5 + in_R8,src,local_88);
  std::array<float,_1280UL>::cbegin((array<float,_1280UL> *)0x21ea39);
  std::array<float,_255UL>::size((array<float,_255UL> *)(in_RDI + 0x14));
  std::array<float,_255UL>::begin((array<float,_255UL> *)0x21ea74);
  std::copy_n<float_const*,unsigned_long,float*>(__first_00,__n,pvVar7);
  ptr = std::array<float,_1152UL>::data((array<float,_1152UL> *)0x21ea97);
  al::span<float,_18446744073709551615UL>::span(&local_a0,ptr,in_R8);
  std::array<float,_1280UL>::data((array<float,_1280UL> *)0x21eac0);
  dst.mDataEnd = pfVar3;
  dst.mData = pfVar5;
  anon_unknown.dwarf_1df10b::allpass_process(dst,src);
  for (local_a8 = 0; local_a8 < in_R8; local_a8 = local_a8 + 1) {
    pvVar8 = std::array<float,_1152UL>::operator[]
                       ((array<float,_1152UL> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    in_stack_fffffffffffffee4 = *pvVar8;
    pvVar8 = std::array<float,_1152UL>::operator[]
                       ((array<float,_1152UL> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    pfVar2[local_a8] = (in_stack_fffffffffffffee4 + *pvVar8) * 0.5;
  }
  for (local_b0 = 0; local_b0 < in_R8; local_b0 = local_b0 + 1) {
    pvVar8 = std::array<float,_1152UL>::operator[]
                       ((array<float,_1152UL> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    in_stack_fffffffffffffee0 = *pvVar8;
    pvVar8 = std::array<float,_1152UL>::operator[]
                       ((array<float,_1152UL> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    pfVar3[local_b0] = (in_stack_fffffffffffffee0 - *pvVar8) * 0.5;
  }
  return;
}

Assistant:

void Uhj2Encoder::encode(FloatBufferLine &LeftOut, FloatBufferLine &RightOut,
    const FloatBufferLine *InSamples, const size_t SamplesToDo)
{
    ASSUME(SamplesToDo > 0);

    float *RESTRICT left{al::assume_aligned<16>(LeftOut.data())};
    float *RESTRICT right{al::assume_aligned<16>(RightOut.data())};

    const float *RESTRICT winput{al::assume_aligned<16>(InSamples[0].data())};
    const float *RESTRICT xinput{al::assume_aligned<16>(InSamples[1].data())};
    const float *RESTRICT yinput{al::assume_aligned<16>(InSamples[2].data())};

    /* Combine the previously delayed mid/side signal with the input. */

    /* S = 0.9396926*W + 0.1855740*X */
    auto miditer = std::copy(mMidDelay.cbegin(), mMidDelay.cend(), mMid.begin());
    std::transform(winput, winput+SamplesToDo, xinput, miditer,
        [](const float w, const float x) noexcept -> float
        { return 0.9396926f*w + 0.1855740f*x; });

    /* D = 0.6554516*Y */
    auto sideiter = std::copy(mSideDelay.cbegin(), mSideDelay.cend(), mSide.begin());
    std::transform(yinput, yinput+SamplesToDo, sideiter,
        [](const float y) noexcept -> float { return 0.6554516f*y; });

    /* Include any existing direct signal in the mid/side buffers. */
    for(size_t i{0};i < SamplesToDo;++i,++miditer)
        *miditer += left[i] + right[i];
    for(size_t i{0};i < SamplesToDo;++i,++sideiter)
        *sideiter += left[i] - right[i];

    /* Copy the future samples back to the delay buffers for next time. */
    std::copy_n(mMid.cbegin()+SamplesToDo, mMidDelay.size(), mMidDelay.begin());
    std::copy_n(mSide.cbegin()+SamplesToDo, mSideDelay.size(), mSideDelay.begin());

    /* Now add the all-passed signal into the side signal. */

    /* D += j(-0.3420201*W + 0.5098604*X) */
    auto tmpiter = std::copy(mSideHistory.cbegin(), mSideHistory.cend(), mTemp.begin());
    std::transform(winput, winput+SamplesToDo, xinput, tmpiter,
        [](const float w, const float x) noexcept -> float
        { return -0.3420201f*w + 0.5098604f*x; });
    std::copy_n(mTemp.cbegin()+SamplesToDo, mSideHistory.size(), mSideHistory.begin());
    allpass_process({mSide.data(), SamplesToDo}, mTemp.data());

    /* Left = (S + D)/2.0 */
    for(size_t i{0};i < SamplesToDo;i++)
        left[i] = (mMid[i] + mSide[i]) * 0.5f;
    /* Right = (S - D)/2.0 */
    for(size_t i{0};i < SamplesToDo;i++)
        right[i] = (mMid[i] - mSide[i]) * 0.5f;
}